

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void RGB565ToYRow_C(uint8_t *src_rgb565,uint8_t *dst_y,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      bVar1 = src_rgb565[lVar3 * 2];
      bVar2 = src_rgb565[lVar3 * 2 + 1];
      bVar4 = bVar1 >> 2 & 7 | bVar1 * '\b';
      bVar5 = bVar2 & 0xf8 | bVar2 >> 5;
      dst_y[lVar3] = (uint8_t)(((uint)bVar4 + (uint)bVar4 * 4) * 5 +
                               (uint)bVar5 * 0x40 + (uint)bVar5 * 2 +
                               (uint)(byte)(bVar2 >> 1 & 3 | bVar1 >> 3 & 0x1c | bVar2 << 5) * 0x81
                               + 0x1080 >> 8);
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}